

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrasterizer.cpp
# Opt level: O0

void __thiscall
QScanConverter::mergeIntersection(QScanConverter *this,Intersection *it,Intersection *isect)

{
  int iVar1;
  Intersection *pIVar2;
  int *local_40;
  Intersection *last;
  int *next;
  Intersection *current;
  Intersection *isect_local;
  Intersection *it_local;
  QScanConverter *this_local;
  
  current = it;
  while( true ) {
    if (isect->x == current->x) {
      current->winding = isect->winding + current->winding;
      return;
    }
    if (isect->x < current->x) {
      local_40 = &current->left;
    }
    else {
      local_40 = &current->right;
    }
    if (*local_40 == 0) break;
    current = current + *local_40;
  }
  pIVar2 = this->m_intersections + this->m_size;
  *local_40 = (int)((long)pIVar2 - (long)current >> 4);
  iVar1 = isect->winding;
  pIVar2->x = isect->x;
  pIVar2->winding = iVar1;
  iVar1 = isect->right;
  pIVar2->left = isect->left;
  pIVar2->right = iVar1;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void QScanConverter::mergeIntersection(Intersection *it, const Intersection &isect)
{
    Intersection *current = it;

    while (isect.x != current->x) {
        int &next = isect.x < current->x ? current->left : current->right;
        if (next)
            current += next;
        else {
            Intersection *last = m_intersections + m_size;
            next = last - current;
            *last = isect;
            ++m_size;
            return;
        }
    }

    current->winding += isect.winding;
}